

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O3

void dump_1D_fdtd(fdtd1D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  ulong uVar4;
  undefined1 in_XMM2 [16];
  
  __stream = fopen(fileName,"w");
  uVar1 = what_to_dump - dump_ez;
  if ((uVar1 < 6) && ((0x35U >> (uVar1 & 0x1f) & 1) != 0)) {
    if (fdtd->sizeX != 0) {
      uVar4 = 0;
      lVar2 = *(long *)((long)fdtd->border_condition +
                       *(long *)(&DAT_00109b28 + (ulong)uVar1 * 8) + -0x30);
      do {
        auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar4);
        fprintf(__stream,"%e %e\n",auVar3._0_8_ * fdtd->dx,*(undefined8 *)(lVar2 + uVar4 * 8));
        uVar4 = uVar4 + 1;
      } while (uVar4 < fdtd->sizeX);
    }
    fclose(__stream);
    return;
  }
  uVar4 = (ulong)what_to_dump;
  dump_1D_fdtd_cold_1();
  free(*(void **)(uVar4 + 0x10));
  free(*(void **)(uVar4 + 0x18));
  free(*(void **)(uVar4 + 0x20));
  free(*(void **)(uVar4 + 0x28));
  free(*(void **)(uVar4 + 0x60));
  free(*(void **)(uVar4 + 0x58));
  free(*(void **)(uVar4 + 0x78));
  free(*(void **)(uVar4 + 0x70));
  return;
}

Assistant:

void dump_1D_fdtd(const struct fdtd1D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  float_type *array;
  switch (what_to_dump) {
  case dump_ez:
    array = fdtd->ez;
    break;
  case dump_hy:
    array = fdtd->hy;
    break;
  case dump_permeability:
    array = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    array = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 1D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    fprintf(out, "%e %e\n", (float_type)i * fdtd->dx, array[i]);
  }
  fclose(out);
}